

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::TryConsumeWhitespace(ParserImpl *this)

{
  TokenType TVar1;
  __type _Var2;
  string local_b0;
  AlphaNum local_90;
  string_view local_60 [3];
  
  this->had_silent_marker_ = false;
  TVar1 = (this->tokenizer_).current_.type;
  if (TVar1 == TYPE_WHITESPACE) {
    local_60[0] = absl::lts_20250127::NullSafeStringView(" ");
    local_90.piece_ = absl::lts_20250127::NullSafeStringView("\t ");
    absl::lts_20250127::StrCat_abi_cxx11_(&local_b0,(lts_20250127 *)local_60,&local_90,&local_90);
    _Var2 = std::operator==(&(this->tokenizer_).current_.text,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    if (_Var2) {
      this->had_silent_marker_ = true;
    }
    io::Tokenizer::Next(&this->tokenizer_);
  }
  return TVar1 == TYPE_WHITESPACE;
}

Assistant:

bool TryConsumeWhitespace() {
    had_silent_marker_ = false;
    if (LookingAtType(io::Tokenizer::TYPE_WHITESPACE)) {
      if (tokenizer_.current().text ==
          absl::StrCat(" ", internal::kDebugStringSilentMarkerForDetection)) {
        had_silent_marker_ = true;
      }
      tokenizer_.Next();
      return true;
    }
    return false;
  }